

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O3

map<int,_njoy::ENDFtk::section::Type<9>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<9>_>_>_>
* __thiscall
njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::section::Type<9>>::
read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (map<int,_njoy::ENDFtk::section::Type<9>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<9>_>_>_>
           *__return_storage_ptr__,
          Base<njoy::ENDFtk::file::Type<9>,njoy::ENDFtk::section::Type<9>> *this,
          StructureDivision *division,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber)

{
  bool bVar1;
  vector<njoy::ENDFtk::section::Type<9>,_std::allocator<njoy::ENDFtk::section::Type<9>_>_> sections;
  vector<njoy::ENDFtk::section::Type<9>,_std::allocator<njoy::ENDFtk::section::Type<9>_>_> local_98;
  undefined1 local_78 [32];
  _Head_base<1UL,_double,_false> local_58;
  _Head_base<0UL,_double,_false> _Stack_50;
  int local_48 [2];
  int local_40;
  
  local_98.
  super__Vector_base<njoy::ENDFtk::section::Type<9>,_std::allocator<njoy::ENDFtk::section::Type<9>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<njoy::ENDFtk::section::Type<9>,_std::allocator<njoy::ENDFtk::section::Type<9>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<njoy::ENDFtk::section::Type<9>,_std::allocator<njoy::ENDFtk::section::Type<9>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    bVar1 = StructureDivision::isSendPermissive((StructureDivision *)this);
    if ((bVar1 && *(int *)(this + 0x34) == 0) && 0 < *(int *)(this + 0x30)) break;
    section::Type<9>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((Type<9> *)local_78,(HEAD *)this,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)division,begin,(long *)end,*(int *)(this + 0x30));
    std::vector<njoy::ENDFtk::section::Type<9>,std::allocator<njoy::ENDFtk::section::Type<9>>>::
    emplace_back<njoy::ENDFtk::section::Type<9>>
              ((vector<njoy::ENDFtk::section::Type<9>,std::allocator<njoy::ENDFtk::section::Type<9>>>
                *)&local_98,(Type<9> *)local_78);
    std::
    vector<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
    ::~vector((vector<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
               *)(local_78 + 0x18));
    StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((StructureDivision *)local_78,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )*(char **)&(division->base).fields.
                            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                            super__Tuple_impl<2UL,_long,_long,_long,_long>.
                            super__Tuple_impl<3UL,_long,_long,_long>.
                            super__Tuple_impl<4UL,_long,_long>,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)division,begin,(long *)end);
    *(double *)(this + 0x20) = local_58._M_head_impl;
    *(double *)(this + 0x28) = _Stack_50._M_head_impl;
    *(undefined8 *)(this + 0x10) = local_78._16_8_;
    *(undefined8 *)(this + 0x18) = local_78._24_8_;
    *(undefined8 *)this = local_78._0_8_;
    *(undefined8 *)(this + 8) = local_78._8_8_;
    *(int *)(this + 0x38) = local_40;
    *(int (*) [2])(this + 0x30) = local_48;
  }
  Base<njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::section::Type<9>_>::verifyFEND
            ((StructureDivision *)this,(long)end->_M_current);
  Base<njoy::ENDFtk::file::Type<9>,_njoy::ENDFtk::section::Type<9>_>::fill
            (__return_storage_ptr__,&local_98);
  std::vector<njoy::ENDFtk::section::Type<9>,_std::allocator<njoy::ENDFtk::section::Type<9>_>_>::
  ~vector(&local_98);
  return __return_storage_ptr__;
}

Assistant:

static auto
read( StructureDivision& division,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber ) {

  std::vector< Section > sections;
  while ( not division.isFend() ) {

    sections.emplace_back( Derived::readSection( division, begin, end, lineNumber ) );
    division = StructureDivision( begin, end, lineNumber );
  }
  verifyFEND( division, lineNumber );
  return fill( std::move( sections ) );
}